

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execChk<(moira::Instr)35,(moira::Mode)0,(moira::Size)2>(Moira *this,u16 opcode)

{
  int iVar1;
  uint uVar2;
  u32 uVar3;
  
  iVar1 = *(int *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58);
  uVar2 = *(uint *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58);
  (*this->_vptr_Moira[0x19])(this,6);
  (this->reg).sr.z = (short)uVar2 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  (this->reg).sr.n = false;
  if (iVar1 * 0x10000 < (int)(uVar2 * 0x10000)) {
    (*this->_vptr_Moira[0x19])(this,2);
    (this->reg).sr.n = (bool)((byte)(uVar2 >> 0xf) & 1);
  }
  else {
    if (-1 < (int)(uVar2 << 0x10)) {
      uVar3 = (this->reg).pc;
      (this->reg).pc0 = uVar3;
      (this->queue).ird = (this->queue).irc;
      uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar3 + 2);
      (this->queue).irc = (u16)uVar3;
      return;
    }
    (*this->_vptr_Moira[0x19])(this,4);
    (this->reg).sr.n = true;
  }
  execTrapException(this,6);
  return;
}

Assistant:

void
Moira::execChk(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    i64 c = clock;
    u32 ea, data, dy;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;
    dy = readD<S>(dst);

    sync(6);

    reg.sr.z = ZERO<S>(dy);
    reg.sr.v = 0;
    reg.sr.c = 0;
    reg.sr.n = MIMIC_MUSASHI ? reg.sr.n : 0;

    if ((i16)dy > (i16)data) {

        sync(MIMIC_MUSASHI ? 10 - (int)(clock - c) : 2);
        reg.sr.n = NBIT<S>(dy);
        execTrapException(6);
        return;
    }

    if ((i16)dy < 0) {

        sync(MIMIC_MUSASHI ? 10 - (int)(clock - c) : 4);
        reg.sr.n = MIMIC_MUSASHI ? NBIT<S>(dy) : 1;
        execTrapException(6);
        return;
    }
    
    prefetch<POLLIPL>();
}